

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Result<void> * __thiscall Chainstate::InvalidateCoinsDBOnDisk(Chainstate *this)

{
  Result<void> *in_RDI;
  long in_FS_OFFSET;
  filesystem_error *e;
  string dest_str;
  string src_str;
  string target;
  string dbpath;
  path invalid_path;
  path snapshot_datadir;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffd8c;
  path *in_stack_fffffffffffffd90;
  char *this_00;
  char *in_stack_fffffffffffffd98;
  path *in_stack_fffffffffffffda0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffda8;
  Chainstate *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffdfc;
  ConstevalFormatString<2U> in_stack_fffffffffffffe38;
  string_view in_stack_fffffffffffffe40;
  string_view in_stack_fffffffffffffe50;
  Level in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  path local_58;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetSnapshotCoinsDBPath(in_stack_fffffffffffffdb0);
  std::unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_>::reset
            ((unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),(pointer)0x14afe8a);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (path *)0x14afe9c);
  fs::operator+(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffd90);
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffd90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  this_00 = "[snapshot] renaming snapshot datadir %s to %s\n";
  uVar1 = 2;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe40,in_stack_fffffffffffffdfc,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_ffffffffffffff30
             ,in_stack_fffffffffffffe38,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  std::filesystem::rename(&local_30,&local_58);
  util::Result<void>::Result((Result<void> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,uVar1));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd8c,uVar1));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd8c,uVar1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> Chainstate::InvalidateCoinsDBOnDisk()
{
    fs::path snapshot_datadir = GetSnapshotCoinsDBPath(*this);

    // Coins views no longer usable.
    m_coins_views.reset();

    auto invalid_path = snapshot_datadir + "_INVALID";
    std::string dbpath = fs::PathToString(snapshot_datadir);
    std::string target = fs::PathToString(invalid_path);
    LogPrintf("[snapshot] renaming snapshot datadir %s to %s\n", dbpath, target);

    // The invalid snapshot datadir is simply moved and not deleted because we may
    // want to do forensics later during issue investigation. The user is instructed
    // accordingly in MaybeCompleteSnapshotValidation().
    try {
        fs::rename(snapshot_datadir, invalid_path);
    } catch (const fs::filesystem_error& e) {
        auto src_str = fs::PathToString(snapshot_datadir);
        auto dest_str = fs::PathToString(invalid_path);

        LogPrintf("%s: error renaming file '%s' -> '%s': %s\n",
                __func__, src_str, dest_str, e.what());
        return util::Error{strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "You should resolve this by manually moving or deleting the invalid "
            "snapshot directory %s, otherwise you will encounter the same error again "
            "on the next startup."),
            src_str, dest_str, src_str)};
    }
    return {};
}